

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall TcpServer::TcpServer(TcpServer *this)

{
  unique_ptr<TcpServerImpl,_std::default_delete<TcpServerImpl>_> local_18;
  TcpServer *local_10;
  TcpServer *this_local;
  
  local_10 = this;
  BaseSocket::BaseSocket(&this->super_BaseSocket);
  (this->super_BaseSocket)._vptr_BaseSocket = (_func_int **)&PTR__TcpServer_001b8938;
  std::make_unique<TcpServerImpl,TcpServer*>((TcpServer **)&local_18);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_BaseSocket).Impl_,&local_18);
  std::unique_ptr<TcpServerImpl,_std::default_delete<TcpServerImpl>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

TcpServer::TcpServer()
{
    Impl_ = make_unique<TcpServerImpl>(this);
}